

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimulationIslandManager.cpp
# Opt level: O3

void __thiscall
btSimulationIslandManager::buildAndProcessIslands
          (btSimulationIslandManager *this,btDispatcher *dispatcher,btCollisionWorld *collisionWorld
          ,IslandCallback *callback)

{
  btElement *pbVar1;
  btCollisionObject *pbVar2;
  btCollisionObject **ptr;
  btPersistentManifold **ppbVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  btCollisionObject **ppbVar9;
  undefined4 extraout_var;
  btPersistentManifold **ppbVar10;
  ulong uVar11;
  btCollisionWorld *pbVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint local_70;
  btPersistentManifoldSortPredicate local_69;
  ulong local_68;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  btCollisionWorld *local_48;
  IslandCallback *local_40;
  long local_38;
  
  local_48 = collisionWorld;
  local_40 = callback;
  buildIslands(this,dispatcher,collisionWorld);
  local_50 = (ulong)(uint)(this->m_unionFind).m_elements.m_size;
  CProfileManager::Start_Profile("processIslands");
  if (this->m_splitIslands == false) {
    iVar7 = (*dispatcher->_vptr_btDispatcher[0xb])(dispatcher);
    uVar8 = (*dispatcher->_vptr_btDispatcher[9])(dispatcher);
    (*local_40->_vptr_IslandCallback[2])
              (local_40,(local_48->m_collisionObjects).m_data,
               (ulong)(uint)(local_48->m_collisionObjects).m_size,CONCAT44(extraout_var,iVar7),
               (ulong)uVar8,0xffffffff);
  }
  else {
    iVar7 = (this->m_islandmanifold).m_size;
    if (1 < (long)iVar7) {
      btAlignedObjectArray<btPersistentManifold_*>::
      quickSortInternal<btPersistentManifoldSortPredicate>
                (&this->m_islandmanifold,&local_69,0,iVar7 + -1);
    }
    if (0 < (int)local_50) {
      uVar11 = 0;
      local_70 = 1;
      local_68 = 0;
      local_38 = (long)iVar7;
      do {
        uVar15 = (ulong)(int)uVar11;
        uVar8 = (this->m_unionFind).m_elements.m_data[uVar15].m_id;
        uVar6 = (int)uVar11 + 1;
        local_58 = (ulong)uVar6;
        if ((int)uVar6 < (int)local_50) {
          local_58 = local_50 & 0xffffffff;
        }
        bVar4 = true;
        pbVar12 = local_48;
        uVar11 = local_50;
        local_5c = uVar8;
        do {
          pbVar1 = (this->m_unionFind).m_elements.m_data;
          uVar5 = uVar15;
          if (pbVar1[uVar15].m_id != uVar8) break;
          pbVar2 = (pbVar12->m_collisionObjects).m_data[pbVar1[uVar15].m_sz];
          uVar6 = (this->m_islandBodies).m_size;
          if (uVar6 == (this->m_islandBodies).m_capacity) {
            iVar7 = uVar6 * 2;
            if (uVar6 == 0) {
              iVar7 = 1;
            }
            if ((int)uVar6 < iVar7) {
              if (iVar7 == 0) {
                ppbVar9 = (btCollisionObject **)0x0;
              }
              else {
                ppbVar9 = (btCollisionObject **)btAlignedAllocInternal((long)iVar7 << 3,0x10);
                uVar6 = (this->m_islandBodies).m_size;
              }
              if (0 < (int)uVar6) {
                uVar11 = 0;
                do {
                  ppbVar9[uVar11] = (this->m_islandBodies).m_data[uVar11];
                  uVar11 = uVar11 + 1;
                } while (uVar6 != uVar11);
              }
              ptr = (this->m_islandBodies).m_data;
              if ((ptr != (btCollisionObject **)0x0) &&
                 ((this->m_islandBodies).m_ownsMemory == true)) {
                btAlignedFreeInternal(ptr);
                uVar6 = (this->m_islandBodies).m_size;
              }
              (this->m_islandBodies).m_ownsMemory = true;
              (this->m_islandBodies).m_data = ppbVar9;
              (this->m_islandBodies).m_capacity = iVar7;
              pbVar12 = local_48;
              uVar11 = local_50;
              uVar8 = local_5c;
            }
          }
          (this->m_islandBodies).m_data[(int)uVar6] = pbVar2;
          (this->m_islandBodies).m_size = uVar6 + 1;
          iVar7 = pbVar2->m_activationState1;
          bVar4 = (bool)((iVar7 == 5 || iVar7 == 2) & bVar4);
          uVar15 = uVar15 + 1;
          uVar5 = local_58;
        } while ((long)uVar15 < (long)uVar11);
        local_58 = uVar5;
        uVar6 = (uint)local_68;
        uVar14 = (uint)local_38;
        if ((int)uVar6 < (int)uVar14) {
          ppbVar3 = (this->m_islandmanifold).m_data;
          lVar13 = (long)(int)uVar6;
          uVar17 = ppbVar3[lVar13]->m_body0->m_islandTag1;
          if ((int)uVar17 < 0) {
            uVar17 = ppbVar3[lVar13]->m_body1->m_islandTag1;
          }
          if (uVar17 == uVar8) {
            ppbVar10 = ppbVar3 + lVar13;
            uVar17 = uVar6;
            uVar16 = uVar6 + 1;
            if ((int)(uVar6 + 1) < (int)uVar14) {
              uVar16 = uVar14;
            }
            do {
              lVar13 = lVar13 + 1;
              local_70 = uVar16;
              if (local_38 <= lVar13) break;
              uVar14 = ppbVar3[lVar13]->m_body0->m_islandTag1;
              if ((int)uVar14 < 0) {
                uVar14 = ppbVar3[lVar13]->m_body1->m_islandTag1;
              }
              local_70 = uVar17 + 1;
              uVar17 = local_70;
            } while (uVar8 == uVar14);
            uVar15 = (ulong)(local_70 - uVar6);
          }
          else {
            uVar15 = 0;
            ppbVar10 = (btPersistentManifold **)0x0;
          }
        }
        else {
          uVar15 = 0;
          ppbVar10 = (btPersistentManifold **)0x0;
        }
        uVar8 = (this->m_islandBodies).m_size;
        if (!bVar4) {
          (*local_40->_vptr_IslandCallback[2])
                    (local_40,(this->m_islandBodies).m_data,(ulong)uVar8,ppbVar10,uVar15,
                     (ulong)local_5c);
          uVar8 = (this->m_islandBodies).m_size;
        }
        uVar11 = local_58;
        local_68 = local_68 & 0xffffffff;
        if ((int)uVar15 != 0) {
          local_68 = (ulong)local_70;
        }
        if ((int)uVar8 < 0) {
          if ((this->m_islandBodies).m_capacity < 0) {
            ppbVar9 = (this->m_islandBodies).m_data;
            if ((ppbVar9 != (btCollisionObject **)0x0) &&
               ((this->m_islandBodies).m_ownsMemory == true)) {
              btAlignedFreeInternal(ppbVar9);
            }
            (this->m_islandBodies).m_ownsMemory = true;
            (this->m_islandBodies).m_data = (btCollisionObject **)0x0;
            (this->m_islandBodies).m_capacity = 0;
          }
          lVar13 = (long)(int)uVar8;
          do {
            (this->m_islandBodies).m_data[lVar13] = (btCollisionObject *)0x0;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0);
        }
        (this->m_islandBodies).m_size = 0;
      } while ((int)uVar11 < (int)local_50);
    }
  }
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void btSimulationIslandManager::buildAndProcessIslands(btDispatcher* dispatcher,btCollisionWorld* collisionWorld, IslandCallback* callback)
{
	btCollisionObjectArray& collisionObjects = collisionWorld->getCollisionObjectArray();

	buildIslands(dispatcher,collisionWorld);

	int endIslandIndex=1;
	int startIslandIndex;
	int numElem = getUnionFind().getNumElements();

	BT_PROFILE("processIslands");

	if(!m_splitIslands)
	{
		btPersistentManifold** manifold = dispatcher->getInternalManifoldPointer();
		int maxNumManifolds = dispatcher->getNumManifolds();
		callback->processIsland(&collisionObjects[0],collisionObjects.size(),manifold,maxNumManifolds, -1);
	}
	else
	{
		// Sort manifolds, based on islands
		// Sort the vector using predicate and std::sort
		//std::sort(islandmanifold.begin(), islandmanifold.end(), btPersistentManifoldSortPredicate);

		int numManifolds = int (m_islandmanifold.size());

		//tried a radix sort, but quicksort/heapsort seems still faster
		//@todo rewrite island management
		m_islandmanifold.quickSort(btPersistentManifoldSortPredicate());
		//m_islandmanifold.heapSort(btPersistentManifoldSortPredicate());

		//now process all active islands (sets of manifolds for now)

		int startManifoldIndex = 0;
		int endManifoldIndex = 1;

		//int islandId;

		

	//	printf("Start Islands\n");

		//traverse the simulation islands, and call the solver, unless all objects are sleeping/deactivated
		for ( startIslandIndex=0;startIslandIndex<numElem;startIslandIndex = endIslandIndex)
		{
			int islandId = getUnionFind().getElement(startIslandIndex).m_id;


			   bool islandSleeping = true;
	                
					for (endIslandIndex = startIslandIndex;(endIslandIndex<numElem) && (getUnionFind().getElement(endIslandIndex).m_id == islandId);endIslandIndex++)
					{
							int i = getUnionFind().getElement(endIslandIndex).m_sz;
							btCollisionObject* colObj0 = collisionObjects[i];
							m_islandBodies.push_back(colObj0);
							if (colObj0->isActive())
									islandSleeping = false;
					}
	                

			//find the accompanying contact manifold for this islandId
			int numIslandManifolds = 0;
			btPersistentManifold** startManifold = 0;

			if (startManifoldIndex<numManifolds)
			{
				int curIslandId = getIslandId(m_islandmanifold[startManifoldIndex]);
				if (curIslandId == islandId)
				{
					startManifold = &m_islandmanifold[startManifoldIndex];
				
					for (endManifoldIndex = startManifoldIndex+1;(endManifoldIndex<numManifolds) && (islandId == getIslandId(m_islandmanifold[endManifoldIndex]));endManifoldIndex++)
					{

					}
					/// Process the actual simulation, only if not sleeping/deactivated
					numIslandManifolds = endManifoldIndex-startManifoldIndex;
				}

			}

			if (!islandSleeping)
			{
				callback->processIsland(&m_islandBodies[0],m_islandBodies.size(),startManifold,numIslandManifolds, islandId);
	//			printf("Island callback of size:%d bodies, %d manifolds\n",islandBodies.size(),numIslandManifolds);
			}
			
			if (numIslandManifolds)
			{
				startManifoldIndex = endManifoldIndex;
			}

			m_islandBodies.resize(0);
		}
	} // else if(!splitIslands) 

}